

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputState xVar2;
  xmlParserInputPtr pxVar3;
  xmlParserCtxtPtr pxVar4;
  uint uVar5;
  int iVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  xmlParserErrors error;
  int iVar12;
  int l;
  int local_44;
  xmlParserCtxtPtr local_40;
  uint local_38;
  int local_34;
  
  local_34 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    local_34 = 50000;
  }
  xVar2 = ctxt->instate;
  if (ctxt->progressive == 0) {
    pxVar3 = ctxt->input;
    if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
       ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  bVar1 = *ctxt->input->cur;
  uVar5 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      pxVar7 = (xmlChar *)0x0;
      error = XML_ERR_LITERAL_NOT_STARTED;
LAB_00159c06:
      xmlFatalErr(ctxt,error,(char *)0x0);
      return pxVar7;
    }
    uVar5 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar7 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar7 == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
  }
  else {
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    local_40 = ctxt;
    local_38 = uVar5;
    uVar5 = xmlCurrentChar(ctxt,&local_44);
    iVar11 = 0;
    iVar12 = 100;
    iVar10 = 0;
    do {
      if ((int)uVar5 < 0x100) {
        if (((int)uVar5 < 0x20) && ((0xd < uVar5 || ((0x2600U >> (uVar5 & 0x1f) & 1) == 0)))) {
          pxVar7[iVar11] = '\0';
          local_40->instate = xVar2;
LAB_00159d25:
          error = XML_ERR_LITERAL_NOT_FINISHED;
          ctxt = local_40;
          goto LAB_00159c06;
        }
        if (uVar5 == local_38) {
          pxVar7[iVar11] = '\0';
          local_40->instate = xVar2;
LAB_00159cbd:
          xmlNextChar(local_40);
          return pxVar7;
        }
      }
      else if ((uVar5 == local_38) ||
              ((uVar5 - 0xfffe < 0xffffe002 && uVar5 - 0x110000 < 0xfff00000) && 0xd7ff < uVar5)) {
        pxVar7[iVar11] = '\0';
        local_40->instate = xVar2;
        if (uVar5 - 0x10000 < 0x100000 || (uVar5 - 0xe000 < 0x1ffe || uVar5 < 0xd800))
        goto LAB_00159cbd;
        goto LAB_00159d25;
      }
      pxVar8 = pxVar7;
      if (iVar12 <= iVar11 + 5) {
        iVar12 = iVar12 * 2;
        pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar7,(long)iVar12);
        if (pxVar8 == (xmlChar *)0x0) {
          (*xmlFree)(pxVar7);
          pxVar4 = local_40;
          xmlErrMemory(local_40,(char *)0x0);
          pxVar4->instate = xVar2;
          return (xmlChar *)0x0;
        }
      }
      pxVar7 = pxVar8;
      pxVar4 = local_40;
      if (iVar10 < 0x32) {
        iVar10 = iVar10 + 1;
      }
      else {
        if (local_40->progressive == 0) {
          pxVar3 = local_40->input;
          if (((((long)pxVar3->cur - (long)pxVar3->base < 0x1f5) ||
               (499 < (long)pxVar3->end - (long)pxVar3->cur)) ||
              (xmlSHRINK(local_40), pxVar4->progressive == 0)) &&
             ((long)pxVar4->input->end - (long)pxVar4->input->cur < 0xfa)) {
            xmlGROW(pxVar4);
          }
        }
        iVar10 = 0;
        if (pxVar4->instate == XML_PARSER_EOF) {
          (*xmlFree)(pxVar7);
          return (xmlChar *)0x0;
        }
      }
      if (local_44 == 1) {
        lVar9 = (long)iVar11;
        iVar11 = iVar11 + 1;
        pxVar7[lVar9] = (xmlChar)uVar5;
      }
      else {
        iVar6 = xmlCopyCharMultiByte(pxVar7 + iVar11,uVar5);
        iVar11 = iVar6 + iVar11;
      }
      pxVar3 = pxVar4->input;
      if (*pxVar3->cur == '\n') {
        pxVar3->line = pxVar3->line + 1;
        pxVar3->col = 1;
      }
      else {
        pxVar3->col = pxVar3->col + 1;
      }
      pxVar3->cur = pxVar3->cur + local_44;
      uVar5 = xmlCurrentChar(pxVar4,&local_44);
      if (uVar5 == 0) {
        if ((pxVar4->progressive == 0) &&
           ((0xf9 < (long)pxVar4->input->end - (long)pxVar4->input->cur ||
            (xmlGROW(pxVar4), pxVar4->progressive == 0)))) {
          pxVar3 = pxVar4->input;
          if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
             ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
            xmlSHRINK(pxVar4);
          }
        }
        uVar5 = xmlCurrentChar(pxVar4,&local_44);
      }
      pxVar4 = local_40;
    } while (iVar11 <= local_34);
    xmlFatalErr(local_40,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
    (*xmlFree)(pxVar7);
    pxVar4->instate = xVar2;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar stop;
    int state = ctxt->instate;
    int count = 0;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
        xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    cur = CUR_CHAR(l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = (xmlParserInputState) state;
		return(NULL);
	    }
	    buf = tmp;
	}
	count++;
	if (count > 50) {
	    SHRINK;
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
	        xmlFree(buf);
		return(NULL);
            }
	}
	COPY_BUF(l,buf,len,cur);
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR_CHAR(l);
	}
        if (len > maxLength) {
            xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
            xmlFree(buf);
            ctxt->instate = (xmlParserInputState) state;
            return(NULL);
        }
    }
    buf[len] = 0;
    ctxt->instate = (xmlParserInputState) state;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}